

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::OP_LdElementUndefined<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementU<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  byte bVar1;
  PropertyId propertyId;
  Var instance;
  
  bVar1 = *(byte *)(*(long *)(this + 0x88) + 0x47);
  instance = GetReg<unsigned_char>(this,playout->Instance);
  propertyId = FunctionBody::GetReferencedPropertyId
                         (*(FunctionBody **)(this + 0x88),(uint)playout->PropertyIdIndex);
  if ((bVar1 & 1) != 0) {
    JavascriptOperators::OP_LoadUndefinedToElementDynamic
              (instance,propertyId,*(ScriptContext **)(this + 0x78));
    return;
  }
  JavascriptOperators::OP_LoadUndefinedToElement(instance,propertyId);
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdElementUndefined(const unaligned OpLayoutT_ElementU<T>* playout)
    {
        if (this->m_functionBody->IsEval())
        {
            JavascriptOperators::OP_LoadUndefinedToElementDynamic(GetReg(playout->Instance),
                this->m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetScriptContext());
        }
        else
        {
            JavascriptOperators::OP_LoadUndefinedToElement(GetReg(playout->Instance),
                this->m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex));
        }
    }